

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O2

void __thiscall
wasm::GlobalTypeRewriter::mapTypeNamesAndIndices(GlobalTypeRewriter *this,TypeMap *oldToNewTypes)

{
  __node_base_ptr *this_00;
  mapped_type mVar1;
  Names *this_01;
  size_t sVar2;
  iterator iVar3;
  mapped_type *this_02;
  iterator iVar4;
  mapped_type *pmVar5;
  __node_base *p_Var6;
  string *in_R9;
  __node_base *p_Var7;
  Name root;
  string local_d8 [32];
  undefined1 local_b8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  typeNames;
  undefined1 auStack_60 [8];
  Name deduped;
  allocator<char> local_31;
  
  local_b8 = (undefined1  [8])&typeNames._M_h._M_rehash_policy._M_next_resize;
  typeNames._M_h._M_buckets = (__buckets_ptr)0x1;
  typeNames._M_h._M_bucket_count = 0;
  typeNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  typeNames._M_h._M_element_count._0_4_ = 0x3f800000;
  typeNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  typeNames._M_h._M_rehash_policy._4_4_ = 0;
  typeNames._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var7 = &(this->wasm->typeNames)._M_h._M_before_begin;
  while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
    std::__detail::
    _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)local_b8,(value_type *)(p_Var7 + 2));
  }
  p_Var6 = &(oldToNewTypes->_M_h)._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    if (p_Var6[1]._M_nxt !=
        *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor) {
      deduped.super_IString.str._M_str = (char *)(p_Var6 + 1);
      iVar3 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->wasm->typeNames)._M_h,(key_type *)deduped.super_IString.str._M_str);
      if (iVar3.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
          _M_cur != (__node_type *)0x0) {
        this_02 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->wasm->typeNames,(key_type *)(p_Var6 + 2));
        TypeNames::operator=
                  (this_02,(TypeNames *)
                           ((long)iVar3.
                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                                  ._M_cur + 0x10));
        this_01 = *(Names **)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                          ._M_cur + 0x10);
        sVar2 = *(size_t *)
                 ((long)iVar3.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>
                        ._M_cur + 0x18);
        typeNames._M_h._M_single_bucket = (__node_base_ptr)local_b8;
        std::__cxx11::string::string<std::allocator<char>>(local_d8,"_",&local_31);
        this_00 = &typeNames._M_h._M_single_bucket;
        root.super_IString.str._M_str = (char *)this_00;
        root.super_IString.str._M_len = sVar2;
        _auStack_60 = (string_view)
                      Names::getValidName(this_01,root,(function<bool_(wasm::Name)> *)0x0,
                                          (Index)local_d8,in_R9);
        std::__cxx11::string::~string(local_d8);
        std::_Function_base::~_Function_base((_Function_base *)this_00);
        (((TypeNames *)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur + 0x10))->name).super_IString.str._M_len = (size_t)auStack_60;
        *(size_t *)
         ((long)iVar3.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
                _M_cur + 0x18) = deduped.super_IString.str._M_len;
        std::__detail::
        _Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::insert((_Insert_base<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)local_b8,(value_type *)auStack_60);
      }
      iVar4 = std::
              _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->wasm->typeIndices)._M_h,(key_type *)deduped.super_IString.str._M_str);
      if (iVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
          _M_cur != (__node_type *)0x0) {
        mVar1 = *(mapped_type *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                        ._M_cur + 0x10);
        pmVar5 = std::__detail::
                 _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->wasm->typeIndices,(key_type *)(p_Var6 + 2));
        *pmVar5 = mVar1;
      }
    }
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_b8);
  return;
}

Assistant:

void GlobalTypeRewriter::mapTypeNamesAndIndices(const TypeMap& oldToNewTypes) {
  // Update type names to avoid duplicates.
  std::unordered_set<Name> typeNames;
  for (auto& [type, info] : wasm.typeNames) {
    typeNames.insert(info.name);
  }
  for (auto& [old, new_] : oldToNewTypes) {
    if (old == new_) {
      // The type is being mapped to itself; no need to rename anything.
      continue;
    }

    if (auto it = wasm.typeNames.find(old); it != wasm.typeNames.end()) {
      auto& oldNames = it->second;
      wasm.typeNames[new_] = oldNames;
      // Use the existing name in the new type, as usually it completely
      // replaces the old. Rename the old name in a unique way to avoid
      // confusion in the case that it remains used.
      auto deduped = Names::getValidName(
        oldNames.name, [&](Name test) { return !typeNames.count(test); });
      oldNames.name = deduped;
      typeNames.insert(deduped);
    }
    if (auto it = wasm.typeIndices.find(old); it != wasm.typeIndices.end()) {
      // It's ok if we end up with duplicate indices. Ties will be resolved in
      // some arbitrary manner.
      wasm.typeIndices[new_] = it->second;
    }
  }
}